

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O3

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_string(ProtocolReader *this,FieldType *value)

{
  int iVar1;
  void *__ptr;
  void *pvVar2;
  undefined8 *puVar3;
  size_t sVar4;
  size_t __size;
  
  __ptr = malloc(0x20);
  if (__ptr == (void *)0x0) {
LAB_001110a1:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::ostream::operator<<;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  iVar1 = (*((this->_stream)._M_t.
             super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
             .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl)->_vptr_Stream
            [2])();
  if (iVar1 < 1) {
    sVar4 = 0;
  }
  else {
    __size = 0x20;
    sVar4 = 0;
    do {
      *(char *)((long)__ptr + sVar4) = (char)iVar1;
      sVar4 = sVar4 + 1;
      pvVar2 = __ptr;
      if (sVar4 == __size) {
        __size = __size * 2;
        pvVar2 = realloc(__ptr,__size);
        if (pvVar2 == (void *)0x0) {
          free(__ptr);
          goto LAB_001110a1;
        }
      }
      __ptr = pvVar2;
      iVar1 = (*((this->_stream)._M_t.
                 super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
                 .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl)->
                _vptr_Stream[2])();
    } while (0 < iVar1);
  }
  if (iVar1 < 0) {
    free(__ptr);
  }
  else {
    *(undefined1 *)((long)__ptr + sVar4) = 0;
    value->f_POINTER = __ptr;
  }
  return -1 < iVar1;
}

Assistant:

bool ProtocolReader::_read_string(FieldType& value)
{
    size_t length = 32;
    size_t pos = 0;
    char* data;

    if (void *tmp = std::malloc(length))
    {
        data = static_cast<char*>(tmp);
    }
    else
    {
        throw std::bad_alloc();
    }

    int c;
    while ((c = _stream->read_byte()) > 0)
    {
        data[pos++] = (char)c;
        if (pos == length)
        {
            length *= 2;
            if (void *tmp = std::realloc(data, length))
            {
                data = static_cast<char*>(tmp);
            }
            else
            {
                std::free(data);
                throw std::bad_alloc();
            }
        }
    }
    if (c < 0)
    {
        std::free(data);
        return false;
    }

    data[pos] = 0;
    value.f_STRING = data;
    return true;
}